

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi.c
# Opt level: O2

void opj_pi_update_encoding_parameters(opj_image_t *p_image,opj_cp_t *p_cp,OPJ_UINT32 p_tile_no)

{
  uint uVar1;
  opj_tcp_t *poVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  uint uVar6;
  OPJ_UINT32 p_ty1;
  OPJ_UINT32 OVar7;
  OPJ_UINT32 OVar8;
  OPJ_UINT32 OVar9;
  OPJ_UINT32 OVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint p_tx1;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  long lVar18;
  uint p_tx0;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  ulong uVar22;
  uint uVar23;
  undefined8 uVar24;
  opj_tccp_t *local_a0;
  opj_image_comp_t *local_98;
  
  if (p_cp == (opj_cp_t *)0x0) {
    __assert_fail("p_cp != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/pi.c"
                  ,0x845,
                  "void opj_pi_update_encoding_parameters(const opj_image_t *, opj_cp_t *, OPJ_UINT32)"
                 );
  }
  if (p_image != (opj_image_t *)0x0) {
    uVar20 = p_cp->tw;
    if (p_tile_no < p_cp->th * uVar20) {
      poVar2 = p_cp->tcps;
      local_98 = p_image->comps;
      local_a0 = poVar2[p_tile_no].tccps;
      uVar6 = p_cp->tdx;
      uVar13 = (p_tile_no % uVar20) * uVar6 + p_cp->tx0;
      uVar23 = p_cp->tdy;
      p_tx0 = p_image->x0;
      if (p_image->x0 < uVar13) {
        p_tx0 = uVar13;
      }
      uVar24 = 0xffffffffffffffff;
      p_tx1 = uVar13 + uVar6;
      if (CARRY4(uVar13,uVar6)) {
        p_tx1 = 0xffffffff;
      }
      if (p_image->x1 <= p_tx1) {
        p_tx1 = p_image->x1;
      }
      uVar6 = (p_tile_no / uVar20) * uVar23 + p_cp->ty0;
      uVar20 = p_image->y0;
      if (p_image->y0 < uVar6) {
        uVar20 = uVar6;
      }
      p_ty1 = uVar6 + uVar23;
      if (CARRY4(uVar6,uVar23)) {
        p_ty1 = 0xffffffff;
      }
      if (p_image->y1 <= p_ty1) {
        p_ty1 = p_image->y1;
      }
      uVar23 = 0x7fffffff;
      uVar6 = 0;
      uVar21 = 0;
      uVar13 = 0x7fffffff;
      for (uVar12 = 0; uVar12 < p_image->numcomps; uVar12 = uVar12 + 1) {
        OVar7 = opj_uint_ceildiv(p_tx0,local_98->dx);
        OVar8 = opj_uint_ceildiv(uVar20,local_98->dy);
        OVar9 = opj_uint_ceildiv(p_tx1,local_98->dx);
        uVar24 = 0x12879f;
        OVar10 = opj_uint_ceildiv(p_ty1,local_98->dy);
        uVar1 = local_a0->numresolutions;
        uVar11 = uVar1;
        for (lVar18 = 0; uVar11 = uVar11 - 1, (ulong)uVar1 << 2 != lVar18; lVar18 = lVar18 + 4) {
          bVar3 = (byte)uVar11;
          bVar4 = (byte)*(undefined4 *)((long)local_a0->prcw + lVar18);
          uVar17 = local_98->dx << (bVar3 + bVar4 & 0x1f);
          bVar5 = (byte)*(undefined4 *)((long)local_a0->prch + lVar18);
          uVar19 = local_98->dy << (bVar3 + bVar5 & 0x1f);
          if (uVar17 <= uVar23) {
            uVar23 = uVar17;
          }
          if (uVar19 <= uVar13) {
            uVar13 = uVar19;
          }
          uVar24 = 0xffffffffffffffff;
          uVar15 = -1L << (bVar3 & 0x3f) ^ 0xffffffffffffffff;
          uVar22 = OVar9 + uVar15 >> (bVar3 & 0x3f);
          uVar16 = uVar15 + OVar10 >> (bVar3 & 0x3f);
          uVar14 = (uint)(OVar7 + uVar15 >> (bVar3 & 0x3f));
          uVar19 = (uint)(OVar8 + uVar15 >> (bVar3 & 0x3f));
          uVar17 = ((int)(~(-1L << (bVar4 & 0x3f)) + (uVar22 & 0xffffffff) >> (bVar4 & 0x3f)) -
                    (uVar14 >> (bVar4 & 0x1f)) << (bVar4 & 0x1f)) >> (bVar4 & 0x1f);
          if (uVar14 == (uint)uVar22) {
            uVar17 = 0;
          }
          uVar14 = ((int)(~(-1L << (bVar5 & 0x3f)) + (uVar16 & 0xffffffff) >> (bVar5 & 0x3f)) -
                    (uVar19 >> (bVar5 & 0x1f)) << (bVar5 & 0x1f)) >> (bVar5 & 0x1f);
          if (uVar19 == (uint)uVar16) {
            uVar14 = 0;
          }
          uVar19 = uVar14 * uVar17;
          if (uVar14 * uVar17 <= uVar6) {
            uVar19 = uVar6;
          }
          uVar6 = uVar19;
        }
        if ((uint)uVar21 < uVar1) {
          uVar21 = (ulong)uVar1;
        }
        local_98 = local_98 + 1;
        local_a0 = local_a0 + 1;
      }
      if ((poVar2[p_tile_no].field_0x1638 & 4) == 0) {
        opj_pi_update_encode_not_poc
                  (p_cp,p_image->numcomps,p_tile_no,p_tx0,p_tx1,uVar20,p_ty1,uVar6,(uint)uVar21,
                   uVar23,uVar13);
      }
      else {
        opj_pi_update_encode_poc_and_final
                  (p_cp,p_tile_no,p_tx0,p_tx1,uVar20,p_ty1,uVar6,uVar23,uVar13,(OPJ_UINT32)uVar24);
      }
      return;
    }
    __assert_fail("p_tile_no < p_cp->tw * p_cp->th",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/pi.c"
                  ,0x847,
                  "void opj_pi_update_encoding_parameters(const opj_image_t *, opj_cp_t *, OPJ_UINT32)"
                 );
  }
  __assert_fail("p_image != 00",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/pi.c"
                ,0x846,
                "void opj_pi_update_encoding_parameters(const opj_image_t *, opj_cp_t *, OPJ_UINT32)"
               );
}

Assistant:

void opj_pi_update_encoding_parameters(const opj_image_t *p_image,
                                       opj_cp_t *p_cp,
                                       OPJ_UINT32 p_tile_no)
{
    /* encoding parameters to set */
    OPJ_UINT32 l_max_res;
    OPJ_UINT32 l_max_prec;
    OPJ_UINT32 l_tx0, l_tx1, l_ty0, l_ty1;
    OPJ_UINT32 l_dx_min, l_dy_min;

    /* pointers */
    opj_tcp_t *l_tcp = 00;

    /* preconditions */
    assert(p_cp != 00);
    assert(p_image != 00);
    assert(p_tile_no < p_cp->tw * p_cp->th);

    l_tcp = &(p_cp->tcps[p_tile_no]);

    /* get encoding parameters */
    opj_get_encoding_parameters(p_image, p_cp, p_tile_no, &l_tx0, &l_tx1, &l_ty0,
                                &l_ty1, &l_dx_min, &l_dy_min, &l_max_prec, &l_max_res);

    if (l_tcp->POC) {
        opj_pi_update_encode_poc_and_final(p_cp, p_tile_no, l_tx0, l_tx1, l_ty0, l_ty1,
                                           l_max_prec, l_max_res, l_dx_min, l_dy_min);
    } else {
        opj_pi_update_encode_not_poc(p_cp, p_image->numcomps, p_tile_no, l_tx0, l_tx1,
                                     l_ty0, l_ty1, l_max_prec, l_max_res, l_dx_min, l_dy_min);
    }
}